

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall Catch::XmlWriter::writeText(XmlWriter *this,string *text,bool indent)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  byte in_DL;
  XmlWriter *in_RDI;
  bool tagWasOpen;
  string *in_stack_00000068;
  XmlWriter *in_stack_00000070;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = in_RDI->m_tagIsOpen;
    ensureTagClosed(in_RDI);
    if (((bVar1 & 1U) != 0) && ((in_DL & 1) != 0)) {
      poVar3 = stream(in_RDI);
      std::operator<<(poVar3,(string *)&in_RDI->m_indent);
    }
    writeEncodedText(in_stack_00000070,in_stack_00000068);
    in_RDI->m_needsNewline = true;
  }
  return in_RDI;
}

Assistant:

XmlWriter& writeText( std::string const& text, bool indent = true ) {
            if( !text.empty() ){
                bool tagWasOpen = m_tagIsOpen;
                ensureTagClosed();
                if( tagWasOpen && indent )
                    stream() << m_indent;
                writeEncodedText( text );
                m_needsNewline = true;
            }
            return *this;
        }